

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

void __thiscall CLI::App::run_callback(App *this,bool final_mode)

{
  bool bVar1;
  reference ppAVar2;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *peVar3;
  ulong uVar4;
  size_t sVar5;
  shared_ptr<CLI::App> *subc_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range2_1;
  App *subc;
  iterator __end2;
  iterator __begin2;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__range2;
  bool final_mode_local;
  App *this_local;
  
  (*this->_vptr_App[2])();
  if ((!final_mode) &&
     (bVar1 = ::std::function::operator_cast_to_bool((function *)&this->parse_complete_callback_),
     bVar1)) {
    std::function<void_()>::operator()(&this->parse_complete_callback_);
  }
  get_subcommands((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin2,this);
  __end2 = std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::begin
                     ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin2);
  subc = (App *)std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::end
                          ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                                     *)&subc), bVar1) {
    ppAVar2 = __gnu_cxx::
              __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
              ::operator*(&__end2);
    run_callback(*ppAVar2,true);
    __gnu_cxx::__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin2);
  __end2_1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
             begin(&this->subcommands_);
  subc_1 = (shared_ptr<CLI::App> *)
           std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::end
                     (&this->subcommands_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                             *)&subc_1), bVar1) {
    this_00 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
              ::operator*(&__end2_1);
    std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              (this_00);
    uVar4 = ::std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_00);
      sVar5 = count_all(peVar3);
      if (sVar5 != 0) {
        peVar3 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(this_00);
        run_callback(peVar3,true);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end2_1);
  }
  bVar1 = ::std::function::operator_cast_to_bool((function *)&this->final_callback_);
  if (((bVar1) && (this->parsed_ != 0)) &&
     ((uVar4 = ::std::__cxx11::string::empty(), (uVar4 & 1) == 0 ||
      (sVar5 = count_all(this), sVar5 != 0)))) {
    std::function<void_()>::operator()(&this->final_callback_);
  }
  return;
}

Assistant:

void run_callback(bool final_mode = false) {
        pre_callback();
        // in the main app if immediate_callback_ is set it runs the main callback before the used subcommands
        if(!final_mode && parse_complete_callback_) {
            parse_complete_callback_();
        }
        // run the callbacks for the received subcommands
        for(App *subc : get_subcommands()) {
            subc->run_callback(true);
        }
        // now run callbacks for option_groups
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && subc->count_all() > 0) {
                subc->run_callback(true);
            }
        }

        // finally run the main callback
        if(final_callback_ && (parsed_ > 0)) {
            if(!name_.empty() || count_all() > 0) {
                final_callback_();
            }
        }
    }